

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O1

void * OPENSSL_sk_delete_ptr(OPENSSL_STACK *sk,void *p)

{
  size_t sVar1;
  void **ppvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t __n;
  long lVar5;
  void *ret;
  
  if ((sk != (OPENSSL_STACK *)0x0) && (sVar1 = sk->num, sVar1 != 0)) {
    ppvVar2 = sk->data;
    lVar5 = 0;
    sVar4 = sVar1;
    do {
      pvVar3 = *(void **)((long)ppvVar2 + lVar5);
      if (pvVar3 == p) {
        if ((sVar4 != 1) && (__n = (sVar1 * 8 + -8) - lVar5, __n != 0)) {
          memmove((void *)((long)ppvVar2 + lVar5),(void *)((long)ppvVar2 + lVar5 + 8),__n);
        }
        sk->num = sk->num - 1;
        return pvVar3;
      }
      lVar5 = lVar5 + 8;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  return (void *)0x0;
}

Assistant:

void *OPENSSL_sk_delete_ptr(OPENSSL_STACK *sk, const void *p) {
  if (sk == NULL) {
    return NULL;
  }

  for (size_t i = 0; i < sk->num; i++) {
    if (sk->data[i] == p) {
      return OPENSSL_sk_delete(sk, i);
    }
  }

  return NULL;
}